

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

string * __thiscall
cmLocalUnixMakefileGenerator3::GetLinkDependencyFile
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,
          cmGeneratorTarget *target,string *param_2)

{
  string local_48;
  string *local_28;
  string *param_2_local;
  cmGeneratorTarget *target_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  local_28 = param_2;
  param_2_local = (string *)target;
  target_local = (cmGeneratorTarget *)this;
  this_local = (cmLocalUnixMakefileGenerator3 *)__return_storage_ptr__;
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_48,target);
  cmStrCat<std::__cxx11::string,char_const(&)[8]>
            (__return_storage_ptr__,&local_48,(char (*) [8])"/link.d");
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::GetLinkDependencyFile(
  cmGeneratorTarget* target, std::string const& /*config*/) const
{
  return cmStrCat(target->GetSupportDirectory(), "/link.d");
}